

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIteratorHelper::FillPatchIteratorHelper
          (FillPatchIteratorHelper *this,AmrLevel *amrlevel,MultiFab *leveldata,int boxGrow,
          Real time,int index,int scomp,int ncomp,InterpBase *mapper)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  undefined4 in_stack_00000008;
  InterpBase *in_stack_000004c8;
  int in_stack_000004d4;
  int in_stack_000004d8;
  int in_stack_000004dc;
  Real in_stack_000004e0;
  int in_stack_000004ec;
  FillPatchIteratorHelper *in_stack_000004f0;
  size_type in_stack_ffffffffffffff68;
  Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  *in_stack_ffffffffffffff70;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  MultiFabCopyDescriptor::MultiFabCopyDescriptor((MultiFabCopyDescriptor *)0x10f97e4);
  std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>::allocator
            ((allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_> *)
             0x10f9813);
  Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ::vector(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(allocator_type *)0x10f9827);
  std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>::~allocator
            ((allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_> *)
             0x10f9833);
  std::map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>::map
            ((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
              *)0x10f9846);
  in_RDI[0x16] = in_XMM0_Qa;
  *(undefined4 *)(in_RDI + 0x17) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0xbc) = in_R8D;
  *(undefined4 *)(in_RDI + 0x18) = in_R9D;
  *(undefined4 *)((long)in_RDI + 0xc4) = in_stack_00000008;
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
         *)0x10f9895);
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
         *)0x10f98ab);
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
         *)0x10f98c1);
  Initialize(in_stack_000004f0,in_stack_000004ec,in_stack_000004e0,in_stack_000004dc,
             in_stack_000004d8,in_stack_000004d4,in_stack_000004c8);
  return;
}

Assistant:

FillPatchIteratorHelper::FillPatchIteratorHelper (AmrLevel&     amrlevel,
                                                  MultiFab&     leveldata,
                                                  int           boxGrow,
                                                  Real          time,
                                                  int           index,
                                                  int           scomp,
                                                  int           ncomp,
                                                  InterpBase*   mapper)
    :
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_mfid(m_amrlevel.level+1),
    m_time(time),
    m_growsize(boxGrow),
    m_index(index),
    m_scomp(scomp),
    m_ncomp(ncomp)
{
    Initialize(boxGrow,time,index,scomp,ncomp,mapper);
}